

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O0

TToken * __thiscall
tcpp::Lexer::_getNextTokenInternal(TToken *__return_storage_ptr__,Lexer *this,bool ignoreQueue)

{
  bool bVar1;
  byte bVar2;
  reference pvVar3;
  ulong uVar4;
  string local_40;
  undefined1 local_1a;
  undefined1 local_19;
  Lexer *pLStack_18;
  bool ignoreQueue_local;
  Lexer *this_local;
  value_type *currToken;
  
  local_19 = ignoreQueue;
  pLStack_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  if ((ignoreQueue) ||
     (bVar1 = Catch::clara::std::__cxx11::list<tcpp::TToken,_std::allocator<tcpp::TToken>_>::empty
                        (&this->mTokensQueue), bVar1)) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      _requestSourceLine_abi_cxx11_(&local_40,this);
      std::__cxx11::string::operator=((string *)&this->mCurrLine,(string *)&local_40);
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_40);
      if ((bVar2 & 1) != 0) {
        TToken::TToken(__return_storage_ptr__,(TToken *)&mEOFToken);
        return __return_storage_ptr__;
      }
    }
    _scanTokens(__return_storage_ptr__,this,&this->mCurrLine);
  }
  else {
    local_1a = 0;
    pvVar3 = Catch::clara::std::__cxx11::list<tcpp::TToken,_std::allocator<tcpp::TToken>_>::front
                       (&this->mTokensQueue);
    TToken::TToken(__return_storage_ptr__,pvVar3);
    Catch::clara::std::__cxx11::list<tcpp::TToken,_std::allocator<tcpp::TToken>_>::pop_front
              (&this->mTokensQueue);
  }
  return __return_storage_ptr__;
}

Assistant:

TToken Lexer::_getNextTokenInternal(bool ignoreQueue) TCPP_NOEXCEPT
	{
		if (!ignoreQueue && !mTokensQueue.empty())
		{
			auto currToken = mTokensQueue.front();
			mTokensQueue.pop_front();

			return currToken;
		}

		if (mCurrLine.empty())
		{
			// \note if it's still empty then we've reached the end of the source
			if ((mCurrLine = _requestSourceLine()).empty())
			{
				return mEOFToken;
			}
		}

		return _scanTokens(mCurrLine);
	}